

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::waitForFinished(QFutureInterfaceBase *this)

{
  long lVar1;
  void *__stat_loc;
  bool bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  bool alreadyFinished;
  QMutexLocker<QMutex> lock;
  TimerType in_stack_ffffffffffffff78;
  ForeverConstant in_stack_ffffffffffffff7c;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffff80;
  QRunnable *in_stack_ffffffffffffff88;
  QThreadPoolPrivate *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar2 = isFinished((QFutureInterfaceBase *)0x6de3df);
  QMutexLocker<QMutex>::unlock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
  if (!bVar2) {
    QFutureInterfaceBasePrivate::pool(in_stack_ffffffffffffff80);
    QThreadPool::d_func((QThreadPool *)0x6de423);
    QThreadPoolPrivate::stealAndRunRunnable(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QMutexLocker<QMutex>::relock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
    while (bVar2 = isFinished((QFutureInterfaceBase *)0x6de44e), ((bVar2 ^ 0xffU) & 1) != 0) {
      __stat_loc = *(void **)(in_RDI + 8);
      in_stack_ffffffffffffff90 = (QThreadPoolPrivate *)((long)__stat_loc + 0x38);
      QDeadlineTimer::QDeadlineTimer
                ((QDeadlineTimer *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff78);
      QWaitCondition::wait((QWaitCondition *)in_stack_ffffffffffffff90,__stat_loc);
    }
  }
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0xd6) & 1) == 0) {
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QtPrivate::ExceptionStore::rethrowException((ExceptionStore *)in_stack_ffffffffffffff90);
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::waitForFinished()
{
    QMutexLocker lock(&d->m_mutex);
    const bool alreadyFinished = isFinished();
    lock.unlock();

    if (!alreadyFinished) {
        d->pool()->d_func()->stealAndRunRunnable(d->runnable);

        lock.relock();

        while (!isFinished())
            d->waitCondition.wait(&d->m_mutex);
    }

    if (d->hasException)
        d->data.m_exceptionStore.rethrowException();
}